

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_find_best_partitioning.cpp
# Opt level: O2

uint find_best_partition_candidates
               (block_size_descriptor *bsd,image_block *blk,uint partition_count,
               uint partition_search_limit,uint *best_partitions,uint requested_candidates)

{
  char *pcVar1;
  byte bVar2;
  uint16_t uVar3;
  ushort uVar4;
  ulong uVar5;
  float fVar6;
  __m128 afVar7;
  float fVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  undefined8 uVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  block_size_descriptor *this;
  byte bVar18;
  uint i;
  uint uVar19;
  uint uVar20;
  undefined4 uVar21;
  ulong uVar22;
  uint64_t *puVar23;
  partition_info *ppVar24;
  partition_metrics *ppVar25;
  uint16_t uVar26;
  ulong uVar27;
  bool bVar28;
  uint uVar29;
  undefined4 in_register_00000014;
  long lVar30;
  ulong uVar31;
  int iVar32;
  int iVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  ulong uVar37;
  uint uVar38;
  undefined4 in_register_0000008c;
  int iVar39;
  int iVar40;
  int iVar41;
  vfloat4 *pvVar42;
  ulong uVar43;
  uint8_t *puVar44;
  bool bVar45;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  float fVar46;
  uint64_t auVar51 [4];
  undefined1 auVar52 [32];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  float fVar69;
  float fVar71;
  undefined1 auVar70 [16];
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar80;
  float fVar81;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  float fVar82;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float local_fdc;
  block_size_descriptor *local_fd8;
  float local_fcc;
  ulong local_fc8;
  ulong local_fc0;
  ulong local_fb8;
  undefined8 local_fb0;
  uint64_t local_fa8;
  uint64_t local_fa0;
  uint64_t local_f98;
  uint local_f8c;
  ulong local_f88;
  uint *local_f80;
  uint64_t local_f78;
  uint64_t local_f70;
  uint64_t local_f68;
  uint64_t local_f60;
  uint64_t *local_f58;
  long local_f50;
  long local_f48;
  long local_f40;
  long local_f38;
  long local_f30;
  uint16_t mscount [64];
  float line_lengths [4];
  uint64_t bitmaps [4];
  undefined1 auStack_e28 [16];
  vfloat4 cluster_centers [4];
  uint samec_best_partitions [8];
  float samec_best_errors [8];
  uint uncor_best_partitions [8];
  float uncor_best_errors [8];
  uint interleave [16];
  undefined8 auStack_c48 [2];
  uint64_t bitmasks [16];
  float afStack_bb8 [224];
  uint16_t partition_sequence [1024];
  
  local_fc0 = CONCAT44(in_register_0000008c,requested_candidates);
  local_fb0 = CONCAT44(in_register_00000014,partition_count);
  bVar2 = bsd->texel_count;
  uVar27 = (ulong)bVar2;
  if (uVar27 < 0x15) {
    fVar46 = 0.03;
  }
  else if (bVar2 < 0x20) {
    fVar46 = 0.04;
  }
  else {
    fVar46 = *(float *)(&DAT_0031aa1c + (ulong)(bVar2 < 0x2a) * 4);
  }
  local_fd8 = bsd;
  if (partition_count == 0) {
    __assert_fail("partition_count > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_find_best_partitioning.cpp"
                  ,0x240,
                  "unsigned int find_best_partition_candidates(const block_size_descriptor &, const image_block &, unsigned int, unsigned int, unsigned int *, unsigned int)"
                 );
  }
  local_f8c = partition_search_limit;
  local_f80 = best_partitions;
  if (partition_search_limit == 0) {
    __assert_fail("partition_search_limit > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_find_best_partitioning.cpp"
                  ,0x241,
                  "unsigned int find_best_partition_candidates(const block_size_descriptor &, const image_block &, unsigned int, unsigned int, unsigned int *, unsigned int)"
                 );
  }
  uVar43 = (ulong)partition_count;
  fVar6 = (blk->channel_weight).m[0];
  fVar72 = (blk->channel_weight).m[1];
  fVar8 = (blk->channel_weight).m[2];
  fVar69 = (blk->channel_weight).m[3];
  for (iVar39 = 0; iVar39 != 0; iVar39 = iVar39 + 1) {
    if (iVar39 == 3) {
      auVar51 = (uint64_t  [4])(ZEXT1232(ZEXT812(0)) << 0x20);
      bitmaps[0] = auVar51[0];
      bitmaps[1] = auVar51[1];
      bitmaps[2] = auVar51[2];
      bitmaps[3] = auVar51[3];
      if (uVar27 == 0) {
        __assert_fail("texels_to_process > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_find_best_partitioning.cpp"
                      ,0x1e5,
                      "unsigned int compute_kmeans_partition_ordering(const block_size_descriptor &, const image_block &, unsigned int, uint16_t *)"
                     );
      }
      local_f88 = 0x40;
      if (bVar2 < 0x40) {
        local_f88 = (ulong)(uint)bVar2;
      }
      for (uVar27 = 0; local_f88 != uVar27; uVar27 = uVar27 + 1) {
        bitmaps[*(byte *)((long)interleave + (ulong)bsd->kmeans_texels[uVar27])] =
             bitmaps[*(byte *)((long)interleave + (ulong)bsd->kmeans_texels[uVar27])] |
             1L << ((byte)uVar27 & 0x3f);
      }
      uVar34 = bsd->partitioning_count_selected[partition_count - 1];
      local_fb8 = (ulong)uVar34;
      if (local_fb8 != 0) {
        if (partition_count == 2) {
          puVar23 = bsd->coverage_bitmaps_2[0] + 1;
          uVar27 = 0;
          while (local_fb8 != uVar27) {
            uVar35 = (int)POPCOUNT(*puVar23 ^ bitmaps[1]) +
                     (int)POPCOUNT((*(uint64_t (*) [2])(puVar23 + -1))[0] ^ bitmaps[0]);
            uVar38 = (int)POPCOUNT((*(uint64_t (*) [2])(puVar23 + -1))[0] ^ bitmaps[1]) +
                     (int)POPCOUNT(*puVar23 ^ bitmaps[0]);
            if (uVar35 < uVar38) {
              uVar38 = uVar35;
            }
            bVar18 = (byte)(uVar38 >> 1);
            *(byte *)((long)bitmasks + uVar27) = bVar18;
            if ((char)uVar38 < '\0') {
              __assert_fail("mismatch_counts[i] < BLOCK_MAX_KMEANS_TEXELS",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_find_best_partitioning.cpp"
                            ,0x17b,
                            "void count_partition_mismatch_bits(const block_size_descriptor &, unsigned int, const uint64_t *, uint8_t *)"
                           );
            }
            uVar27 = uVar27 + 1;
            puVar23 = puVar23 + 2;
            if (bVar2 <= bVar18) {
              __assert_fail("mismatch_counts[i] < bsd.texel_count",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_find_best_partitioning.cpp"
                            ,0x17c,
                            "void count_partition_mismatch_bits(const block_size_descriptor &, unsigned int, const uint64_t *, uint8_t *)"
                           );
            }
          }
        }
        else if (partition_count == 3) {
          local_f98 = bitmaps[0];
          local_fa0 = bitmaps[1];
          local_fa8 = bitmaps[2];
          puVar23 = bsd->coverage_bitmaps_3[0] + 2;
          uVar27 = 0;
          while (local_fb8 != uVar27) {
            uVar22 = (*(uint64_t (*) [3])(puVar23 + -2))[0];
            uVar31 = puVar23[-1];
            local_fc8 = POPCOUNT(uVar31 ^ bitmaps[0]);
            uVar37 = *puVar23;
            iVar39 = (int)POPCOUNT(uVar37 ^ bitmaps[2]);
            iVar9 = (int)POPCOUNT(uVar31 ^ bitmaps[1]);
            uVar35 = iVar39 + iVar9;
            iVar10 = (int)POPCOUNT(uVar37 ^ bitmaps[1]);
            iVar32 = (int)POPCOUNT(uVar31 ^ bitmaps[2]);
            uVar38 = iVar10 + iVar32;
            if (uVar35 < uVar38) {
              uVar38 = uVar35;
            }
            uVar38 = uVar38 + (int)POPCOUNT(uVar22 ^ bitmaps[0]);
            iVar41 = (int)POPCOUNT(uVar22 ^ bitmaps[1]);
            uVar29 = iVar39 + iVar41;
            iVar39 = (int)POPCOUNT(uVar22 ^ bitmaps[2]);
            uVar35 = iVar10 + iVar39;
            if (uVar29 < uVar35) {
              uVar35 = uVar29;
            }
            uVar19 = iVar32 + iVar41;
            uVar29 = iVar9 + iVar39;
            if (uVar19 < uVar29) {
              uVar29 = uVar19;
            }
            uVar29 = uVar29 + (int)POPCOUNT(uVar37 ^ bitmaps[0]);
            uVar19 = uVar35 + (int)(float)local_fc8;
            if (uVar38 < uVar35 + (int)(float)local_fc8) {
              uVar19 = uVar38;
            }
            if (uVar29 <= uVar19) {
              uVar19 = uVar29;
            }
            bVar18 = (byte)uVar19 >> 1;
            *(byte *)((long)bitmasks + uVar27) = bVar18;
            if ((char)(byte)uVar19 < '\0') {
              __assert_fail("mismatch_counts[i] < BLOCK_MAX_KMEANS_TEXELS",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_find_best_partitioning.cpp"
                            ,0x184,
                            "void count_partition_mismatch_bits(const block_size_descriptor &, unsigned int, const uint64_t *, uint8_t *)"
                           );
            }
            uVar27 = uVar27 + 1;
            puVar23 = puVar23 + 3;
            if (bVar2 <= bVar18) {
              __assert_fail("mismatch_counts[i] < bsd.texel_count",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_find_best_partitioning.cpp"
                            ,0x185,
                            "void count_partition_mismatch_bits(const block_size_descriptor &, unsigned int, const uint64_t *, uint8_t *)"
                           );
            }
          }
        }
        else {
          local_f60 = bitmaps[0];
          local_f68 = bitmaps[1];
          local_f70 = bitmaps[2];
          local_f78 = bitmaps[3];
          uVar27 = 0;
          puVar23 = bsd->coverage_bitmaps_4[0] + 3;
          while (local_fb8 != uVar27) {
            uVar22 = (*(uint64_t (*) [4])(puVar23 + -3))[0];
            uVar31 = puVar23[-2];
            local_f30 = POPCOUNT(uVar22 ^ bitmaps[0]);
            local_fa8 = POPCOUNT(uVar31 ^ bitmaps[0]);
            uVar37 = puVar23[-1];
            local_fa0 = POPCOUNT(uVar37 ^ bitmaps[0]);
            uVar5 = *puVar23;
            local_f98 = POPCOUNT(uVar5 ^ bitmaps[0]);
            local_f38 = POPCOUNT(uVar22 ^ bitmaps[1]);
            local_f40 = POPCOUNT(uVar31 ^ bitmaps[1]);
            local_f48 = POPCOUNT(uVar37 ^ bitmaps[1]);
            local_f50 = POPCOUNT(uVar22 ^ bitmaps[2]);
            iVar39 = (int)POPCOUNT(uVar5 ^ bitmaps[3]);
            iVar9 = (int)POPCOUNT(uVar37 ^ bitmaps[2]);
            iVar10 = (int)POPCOUNT(uVar5 ^ bitmaps[2]);
            iVar32 = (int)POPCOUNT(uVar37 ^ bitmaps[3]);
            uVar38 = iVar10 + iVar32;
            if ((uint)(iVar39 + iVar9) < (uint)(iVar10 + iVar32)) {
              uVar38 = iVar39 + iVar9;
            }
            iVar41 = (int)POPCOUNT(uVar31 ^ bitmaps[2]);
            iVar11 = (int)POPCOUNT(uVar31 ^ bitmaps[3]);
            uVar35 = iVar10 + iVar11;
            if ((uint)(iVar39 + iVar41) < (uint)(iVar10 + iVar11)) {
              uVar35 = iVar39 + iVar41;
            }
            uVar29 = iVar9 + iVar11;
            if ((uint)(iVar32 + iVar41) < (uint)(iVar9 + iVar11)) {
              uVar29 = iVar32 + iVar41;
            }
            iVar40 = (int)local_f50;
            iVar33 = (int)POPCOUNT(uVar22 ^ bitmaps[3]);
            uVar19 = iVar10 + iVar33;
            if ((uint)(iVar39 + iVar40) < (uint)(iVar10 + iVar33)) {
              uVar19 = iVar39 + iVar40;
            }
            uVar12 = iVar9 + iVar33;
            if ((uint)(iVar32 + iVar40) < (uint)(iVar9 + iVar33)) {
              uVar12 = iVar32 + iVar40;
            }
            uVar13 = iVar11 + iVar40;
            if ((uint)(iVar41 + iVar33) < (uint)(iVar11 + iVar40)) {
              uVar13 = iVar41 + iVar33;
            }
            iVar39 = (int)local_f40;
            iVar9 = (int)local_f48;
            uVar20 = uVar35 + iVar9;
            if (uVar38 + iVar39 < uVar35 + iVar9) {
              uVar20 = uVar38 + iVar39;
            }
            iVar10 = (int)POPCOUNT(uVar5 ^ bitmaps[1]);
            if (uVar29 + iVar10 <= uVar20) {
              uVar20 = uVar29 + iVar10;
            }
            iVar32 = (int)local_f38;
            uVar36 = uVar38 + iVar32;
            if (uVar19 + iVar9 <= uVar38 + iVar32) {
              uVar36 = uVar19 + iVar9;
            }
            if (uVar12 + iVar10 <= uVar36) {
              uVar36 = uVar12 + iVar10;
            }
            uVar38 = uVar35 + iVar32;
            if (uVar19 + iVar39 < uVar35 + iVar32) {
              uVar38 = uVar19 + iVar39;
            }
            if (iVar10 + uVar13 <= uVar38) {
              uVar38 = iVar10 + uVar13;
            }
            uVar35 = uVar13 + iVar9;
            if (uVar12 + iVar39 < uVar13 + iVar9) {
              uVar35 = uVar12 + iVar39;
            }
            if (uVar29 + iVar32 <= uVar35) {
              uVar35 = uVar29 + iVar32;
            }
            uVar29 = uVar36 + (int)local_fa8;
            if (uVar20 + (int)local_f30 < uVar36 + (int)local_fa8) {
              uVar29 = uVar20 + (int)local_f30;
            }
            uVar19 = uVar35 + (int)local_f98;
            if (uVar38 + (int)local_fa0 < uVar35 + (int)local_f98) {
              uVar19 = uVar38 + (int)local_fa0;
            }
            if (uVar29 < uVar19) {
              uVar19 = uVar29;
            }
            bVar18 = (byte)(uVar19 >> 1);
            *(byte *)((long)bitmasks + uVar27) = bVar18;
            local_fc8 = uVar27;
            local_f58 = puVar23;
            if (0x7f < uVar19) {
              __assert_fail("mismatch_counts[i] < BLOCK_MAX_KMEANS_TEXELS",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_find_best_partitioning.cpp"
                            ,0x18d,
                            "void count_partition_mismatch_bits(const block_size_descriptor &, unsigned int, const uint64_t *, uint8_t *)"
                           );
            }
            uVar27 = uVar27 + 1;
            puVar23 = puVar23 + 4;
            if (bVar2 <= bVar18) {
              __assert_fail("mismatch_counts[i] < bsd.texel_count",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_find_best_partitioning.cpp"
                            ,0x18e,
                            "void count_partition_mismatch_bits(const block_size_descriptor &, unsigned int, const uint64_t *, uint8_t *)"
                           );
            }
          }
        }
        auVar52 = ZEXT432(0) << 0x20;
        mscount[0x30] = auVar52._0_2_;
        mscount[0x31] = auVar52._2_2_;
        mscount[0x32] = auVar52._4_2_;
        mscount[0x33] = auVar52._6_2_;
        mscount[0x34] = auVar52._8_2_;
        mscount[0x35] = auVar52._10_2_;
        mscount[0x36] = auVar52._12_2_;
        mscount[0x37] = auVar52._14_2_;
        mscount[0x38] = auVar52._16_2_;
        mscount[0x39] = auVar52._18_2_;
        mscount[0x3a] = auVar52._20_2_;
        mscount[0x3b] = auVar52._22_2_;
        mscount[0x3c] = auVar52._24_2_;
        mscount[0x3d] = auVar52._26_2_;
        mscount[0x3e] = auVar52._28_2_;
        mscount[0x3f] = auVar52._30_2_;
        mscount[0x20] = auVar52._0_2_;
        mscount[0x21] = auVar52._2_2_;
        mscount[0x22] = auVar52._4_2_;
        mscount[0x23] = auVar52._6_2_;
        mscount[0x24] = auVar52._8_2_;
        mscount[0x25] = auVar52._10_2_;
        mscount[0x26] = auVar52._12_2_;
        mscount[0x27] = auVar52._14_2_;
        mscount[0x28] = auVar52._16_2_;
        mscount[0x29] = auVar52._18_2_;
        mscount[0x2a] = auVar52._20_2_;
        mscount[0x2b] = auVar52._22_2_;
        mscount[0x2c] = auVar52._24_2_;
        mscount[0x2d] = auVar52._26_2_;
        mscount[0x2e] = auVar52._28_2_;
        mscount[0x2f] = auVar52._30_2_;
        auVar52 = ZEXT432(0) << 0x20;
        mscount[0x10] = auVar52._0_2_;
        mscount[0x11] = auVar52._2_2_;
        mscount[0x12] = auVar52._4_2_;
        mscount[0x13] = auVar52._6_2_;
        mscount[0x14] = auVar52._8_2_;
        mscount[0x15] = auVar52._10_2_;
        mscount[0x16] = auVar52._12_2_;
        mscount[0x17] = auVar52._14_2_;
        mscount[0x18] = auVar52._16_2_;
        mscount[0x19] = auVar52._18_2_;
        mscount[0x1a] = auVar52._20_2_;
        mscount[0x1b] = auVar52._22_2_;
        mscount[0x1c] = auVar52._24_2_;
        mscount[0x1d] = auVar52._26_2_;
        mscount[0x1e] = auVar52._28_2_;
        mscount[0x1f] = auVar52._30_2_;
        mscount[0] = auVar52._0_2_;
        mscount[1] = auVar52._2_2_;
        mscount[2] = auVar52._4_2_;
        mscount[3] = auVar52._6_2_;
        mscount[4] = auVar52._8_2_;
        mscount[5] = auVar52._10_2_;
        mscount[6] = auVar52._12_2_;
        mscount[7] = auVar52._14_2_;
        mscount[8] = auVar52._16_2_;
        mscount[9] = auVar52._18_2_;
        mscount[10] = auVar52._20_2_;
        mscount[0xb] = auVar52._22_2_;
        mscount[0xc] = auVar52._24_2_;
        mscount[0xd] = auVar52._26_2_;
        mscount[0xe] = auVar52._28_2_;
        mscount[0xf] = auVar52._30_2_;
        for (uVar27 = 0; local_fb8 != uVar27; uVar27 = uVar27 + 1) {
          mscount[*(byte *)((long)bitmasks + uVar27)] =
               mscount[*(byte *)((long)bitmasks + uVar27)] + 1;
        }
        uVar26 = 0;
        for (uVar27 = 0; local_f88 != uVar27; uVar27 = uVar27 + 1) {
          uVar3 = mscount[uVar27];
          mscount[uVar27] = uVar26;
          uVar26 = uVar3 + uVar26;
        }
        for (uVar27 = 0; local_fb8 != uVar27; uVar27 = uVar27 + 1) {
          uVar4 = mscount[*(byte *)((long)bitmasks + uVar27)];
          mscount[*(byte *)((long)bitmasks + uVar27)] = uVar4 + 1;
          partition_sequence[uVar4] = (uint16_t)uVar27;
        }
        uVar38 = partition_search_limit;
        if (uVar34 <= partition_search_limit) {
          uVar38 = uVar34;
        }
        local_fc0 = (ulong)requested_candidates;
        if (uVar38 < requested_candidates) {
          local_fc0 = (ulong)uVar38;
        }
        auVar83 = vcmpps_avx(*(undefined1 (*) [16])(blk->data_max).m,
                             *(undefined1 (*) [16])(blk->data_min).m,0);
        auVar83 = vblendps_avx(ZEXT816(0),auVar83,8);
        uVar21 = vmovmskps_avx(auVar83);
        for (uVar27 = 0; local_fc0 != uVar27; uVar27 = uVar27 + 1) {
          uncor_best_errors[uVar27] = 1e+30;
          samec_best_errors[uVar27] = 1e+30;
        }
        local_fc8 = CONCAT44(local_fc8._4_4_,fVar46 * fVar46);
        local_fb8 = (ulong)uVar38;
        if ((char)uVar21 == '\0') {
          for (uVar27 = 0; uVar27 != local_fb8; uVar27 = uVar27 + 1) {
            uVar4 = partition_sequence[uVar27];
            ppVar24 = block_size_descriptor::get_raw_partition_info
                                (local_fd8,(uint)local_fb0,(uint)uVar4);
            compute_avgs_and_dirs_4_comp(ppVar24,blk,(partition_metrics *)bitmasks);
            auVar83._8_4_ = 0x3f000000;
            auVar83._0_8_ = 0x3f0000003f000000;
            auVar83._12_4_ = 0x3f000000;
            lVar30 = 0x10;
            uVar22 = uVar43;
            while (bVar45 = uVar22 != 0, uVar22 = uVar22 - 1, bVar45) {
              uVar14 = *(undefined8 *)((long)auStack_c48 + lVar30 + 8);
              *(undefined8 *)((long)uncor_best_errors + lVar30 + 0x10) =
                   *(undefined8 *)((long)auStack_c48 + lVar30);
              *(undefined8 *)((long)uncor_best_errors + lVar30 + 0x18) = uVar14;
              auVar84 = *(undefined1 (*) [16])((long)bitmasks + lVar30);
              auVar55._0_4_ = auVar84._0_4_ * auVar84._0_4_;
              auVar55._4_4_ = auVar84._4_4_ * auVar84._4_4_;
              auVar55._8_4_ = auVar84._8_4_ * auVar84._8_4_;
              auVar55._12_4_ = auVar84._12_4_ * auVar84._12_4_;
              auVar85 = vshufpd_avx(auVar55,auVar55,1);
              auVar56._0_4_ = auVar55._0_4_ + auVar85._0_4_;
              auVar56._4_4_ = auVar55._4_4_ + auVar85._4_4_;
              auVar56._8_4_ = auVar55._8_4_ + auVar85._8_4_;
              auVar56._12_4_ = auVar55._12_4_ + auVar85._12_4_;
              auVar85 = vhaddps_avx(auVar56,auVar56);
              fVar46 = auVar85._0_4_;
              auVar64._4_4_ = fVar46;
              auVar64._0_4_ = fVar46;
              auVar64._8_4_ = fVar46;
              auVar64._12_4_ = fVar46;
              auVar85 = vsqrtps_avx(auVar64);
              auVar84 = vdivps_avx(auVar84,auVar85);
              if ((fVar46 == 0.0) && (!NAN(fVar46))) {
                auVar84 = auVar83;
              }
              *(undefined1 (*) [16])((long)interleave + lVar30) = auVar84;
              auVar85 = *(undefined1 (*) [16])((long)uncor_best_errors + lVar30 + 0x10);
              auVar65._0_4_ = auVar85._0_4_ * auVar84._0_4_;
              auVar65._4_4_ = auVar85._4_4_ * auVar84._4_4_;
              auVar65._8_4_ = auVar85._8_4_ * auVar84._8_4_;
              auVar65._12_4_ = auVar85._12_4_ * auVar84._12_4_;
              auVar86 = vshufpd_avx(auVar65,auVar65,1);
              auVar66._0_4_ = auVar65._0_4_ + auVar86._0_4_;
              auVar66._4_4_ = auVar65._4_4_ + auVar86._4_4_;
              auVar66._8_4_ = auVar65._8_4_ + auVar86._8_4_;
              auVar66._12_4_ = auVar65._12_4_ + auVar86._12_4_;
              auVar87 = vhaddps_avx(auVar66,auVar66);
              auVar86 = *(undefined1 (*) [16])((long)auStack_c48 + lVar30);
              fVar46 = auVar87._0_4_;
              auVar48._0_4_ = auVar84._0_4_ * fVar46;
              auVar48._4_4_ = auVar84._4_4_ * fVar46;
              auVar48._8_4_ = auVar84._8_4_ * fVar46;
              auVar48._12_4_ = auVar84._12_4_ * fVar46;
              auVar84 = vsubps_avx(auVar85,auVar48);
              *(undefined1 (*) [16])(auStack_e28 + lVar30) = auVar84;
              uVar14 = *(undefined8 *)((long)interleave + lVar30 + 8);
              *(undefined8 *)((long)cluster_centers[0].m + lVar30) =
                   *(undefined8 *)((long)interleave + lVar30);
              *(undefined8 *)((long)cluster_centers[0].m + lVar30 + 8) = uVar14;
              *(undefined8 *)((long)&local_f38 + lVar30) = 0;
              *(undefined8 *)((long)mscount + lVar30 + -8) = 0;
              auVar49._0_4_ = auVar86._0_4_ * auVar86._0_4_;
              auVar49._4_4_ = auVar86._4_4_ * auVar86._4_4_;
              auVar49._8_4_ = auVar86._8_4_ * auVar86._8_4_;
              auVar49._12_4_ = auVar86._12_4_ * auVar86._12_4_;
              auVar84 = vshufpd_avx(auVar49,auVar49,1);
              auVar50._0_4_ = auVar49._0_4_ + auVar84._0_4_;
              auVar50._4_4_ = auVar49._4_4_ + auVar84._4_4_;
              auVar50._8_4_ = auVar49._8_4_ + auVar84._8_4_;
              auVar50._12_4_ = auVar49._12_4_ + auVar84._12_4_;
              auVar84 = vhaddps_avx(auVar50,auVar50);
              fVar46 = auVar84._0_4_;
              auVar57._4_4_ = fVar46;
              auVar57._0_4_ = fVar46;
              auVar57._8_4_ = fVar46;
              auVar57._12_4_ = fVar46;
              auVar84 = vsqrtps_avx(auVar57);
              auVar84 = vdivps_avx(auVar86,auVar84);
              if ((fVar46 == 0.0) && (!NAN(fVar46))) {
                auVar84 = auVar83;
              }
              *(undefined1 (*) [16])((long)mscount + lVar30) = auVar84;
              *(undefined8 *)((long)line_lengths + lVar30) = 0;
              *(undefined8 *)((long)line_lengths + lVar30 + 8) = 0;
              uVar14 = *(undefined8 *)((long)mscount + lVar30 + 8);
              *(undefined8 *)((long)bitmaps + lVar30) = *(undefined8 *)((long)mscount + lVar30);
              *(undefined8 *)((long)bitmaps + lVar30 + 8) = uVar14;
              lVar30 = lVar30 + 0x20;
            }
            local_fcc = 0.0;
            local_fdc = 0.0;
            compute_error_squared_rgba
                      (ppVar24,blk,(processed_line4 *)cluster_centers,(processed_line4 *)bitmaps,
                       line_lengths,&local_fcc,&local_fdc);
            puVar44 = ppVar24->partition_texel_count;
            for (lVar30 = 0; uVar43 * 4 - lVar30 != 0; lVar30 = lVar30 + 4) {
              fVar6 = (float)local_fc8 * (float)*puVar44;
              fVar46 = *(float *)((long)line_lengths + lVar30);
              auVar78._0_4_ =
                   fVar6 * fVar46 * (float)interleave[lVar30 * 2 + 4] *
                           fVar46 * (float)interleave[lVar30 * 2 + 4];
              auVar78._4_4_ =
                   fVar6 * fVar46 * (float)interleave[lVar30 * 2 + 5] *
                           fVar46 * (float)interleave[lVar30 * 2 + 5];
              auVar78._8_4_ =
                   fVar6 * fVar46 * (float)interleave[lVar30 * 2 + 6] *
                           fVar46 * (float)interleave[lVar30 * 2 + 6];
              auVar78._12_4_ =
                   fVar6 * fVar46 * (float)interleave[lVar30 * 2 + 7] *
                           fVar46 * (float)interleave[lVar30 * 2 + 7];
              auVar83 = vshufpd_avx(auVar78,auVar78,1);
              auVar79._0_4_ = auVar78._0_4_ + auVar83._0_4_;
              auVar79._4_4_ = auVar78._4_4_ + auVar83._4_4_;
              auVar79._8_4_ = auVar78._8_4_ + auVar83._8_4_;
              auVar79._12_4_ = auVar78._12_4_ + auVar83._12_4_;
              auVar83 = vhaddps_avx(auVar79,auVar79);
              auVar67._0_4_ =
                   fVar6 * fVar46 * *(float *)(mscount + lVar30 * 4 + 8) *
                           fVar46 * *(float *)(mscount + lVar30 * 4 + 8);
              auVar67._4_4_ =
                   fVar6 * fVar46 * *(float *)(mscount + lVar30 * 4 + 10) *
                           fVar46 * *(float *)(mscount + lVar30 * 4 + 10);
              auVar67._8_4_ =
                   fVar6 * fVar46 * *(float *)(mscount + lVar30 * 4 + 0xc) *
                           fVar46 * *(float *)(mscount + lVar30 * 4 + 0xc);
              auVar67._12_4_ =
                   fVar6 * fVar46 * *(float *)(mscount + lVar30 * 4 + 0xe) *
                           fVar46 * *(float *)(mscount + lVar30 * 4 + 0xe);
              auVar84 = vshufpd_avx(auVar67,auVar67,1);
              auVar68._0_4_ = auVar67._0_4_ + auVar84._0_4_;
              auVar68._4_4_ = auVar67._4_4_ + auVar84._4_4_;
              auVar68._8_4_ = auVar67._8_4_ + auVar84._8_4_;
              auVar68._12_4_ = auVar67._12_4_ + auVar84._12_4_;
              auVar84 = vhaddps_avx(auVar68,auVar68);
              local_fcc = local_fcc + auVar83._0_4_;
              local_fdc = local_fdc + auVar84._0_4_;
              puVar44 = puVar44 + 1;
            }
            uVar34 = (uint)local_fc0;
            insert_result(uVar34,local_fcc,(uint)uVar4,uncor_best_errors,uncor_best_partitions);
            insert_result(uVar34,local_fdc,(uint)uVar4,samec_best_errors,samec_best_partitions);
          }
        }
        else {
          for (uVar27 = 0; uVar27 != local_fb8; uVar27 = uVar27 + 1) {
            uVar4 = partition_sequence[uVar27];
            ppVar24 = block_size_descriptor::get_raw_partition_info
                                (local_fd8,(uint)local_fb0,(uint)uVar4);
            compute_avgs_and_dirs_3_comp_rgb(ppVar24,blk,(partition_metrics *)interleave);
            ppVar25 = (partition_metrics *)interleave;
            for (lVar30 = 0; uVar43 * 0x90 - lVar30 != 0; lVar30 = lVar30 + 0x90) {
              uVar14 = *(undefined8 *)((ppVar25->avg).m + 2);
              *(undefined8 *)((long)bitmasks + lVar30) = *(undefined8 *)(ppVar25->avg).m;
              *(undefined8 *)((long)bitmasks + lVar30 + 8) = uVar14;
              auVar83 = *(undefined1 (*) [16])(ppVar25->dir).m;
              auVar53._0_4_ = auVar83._0_4_ * auVar83._0_4_;
              auVar53._4_4_ = auVar83._4_4_ * auVar83._4_4_;
              auVar53._8_4_ = auVar83._8_4_ * auVar83._8_4_;
              auVar53._12_4_ = auVar83._12_4_ * auVar83._12_4_;
              auVar84 = vshufpd_avx(auVar53,auVar53,1);
              auVar54._0_4_ = auVar53._0_4_ + auVar84._0_4_;
              auVar54._4_4_ = auVar53._4_4_ + auVar84._4_4_;
              auVar54._8_4_ = auVar53._8_4_ + auVar84._8_4_;
              auVar54._12_4_ = auVar53._12_4_ + auVar84._12_4_;
              auVar84 = vhaddps_avx(auVar54,auVar54);
              fVar46 = auVar84._0_4_;
              auVar58._4_4_ = fVar46;
              auVar58._0_4_ = fVar46;
              auVar58._8_4_ = fVar46;
              auVar58._12_4_ = fVar46;
              auVar84 = vsqrtps_avx(auVar58);
              auVar83 = vdivps_avx(auVar83,auVar84);
              if ((fVar46 == 0.0) && (!NAN(fVar46))) {
                auVar83 = _DAT_0031aa30;
              }
              *(undefined1 (*) [16])((long)bitmasks + lVar30 + 0x10) = auVar83;
              *(undefined8 *)((long)bitmasks + lVar30 + 0x20) = 0;
              *(undefined8 *)((long)bitmasks + lVar30 + 0x28) = 0;
              auVar84 = *(undefined1 (*) [16])(ppVar25->avg).m;
              auVar59._0_4_ = auVar84._0_4_ * auVar84._0_4_;
              auVar59._4_4_ = auVar84._4_4_ * auVar84._4_4_;
              auVar59._8_4_ = auVar84._8_4_ * auVar84._8_4_;
              auVar59._12_4_ = auVar84._12_4_ * auVar84._12_4_;
              auVar85 = vshufpd_avx(auVar59,auVar59,1);
              auVar60._0_4_ = auVar59._0_4_ + auVar85._0_4_;
              auVar60._4_4_ = auVar59._4_4_ + auVar85._4_4_;
              auVar60._8_4_ = auVar59._8_4_ + auVar85._8_4_;
              auVar60._12_4_ = auVar59._12_4_ + auVar85._12_4_;
              auVar85 = vhaddps_avx(auVar60,auVar60);
              fVar46 = auVar85._0_4_;
              auVar70._4_4_ = fVar46;
              auVar70._0_4_ = fVar46;
              auVar70._8_4_ = fVar46;
              auVar70._12_4_ = fVar46;
              auVar85 = vsqrtps_avx(auVar70);
              auVar84 = vdivps_avx(auVar84,auVar85);
              if ((fVar46 == 0.0) && (!NAN(fVar46))) {
                auVar84 = _DAT_0031aa30;
              }
              *(undefined1 (*) [16])((long)bitmasks + lVar30 + 0x30) = auVar84;
              auVar84 = *(undefined1 (*) [16])((long)bitmasks + lVar30);
              auVar61._0_4_ = auVar84._0_4_ * auVar83._0_4_;
              auVar61._4_4_ = auVar84._4_4_ * auVar83._4_4_;
              auVar61._8_4_ = auVar84._8_4_ * auVar83._8_4_;
              auVar61._12_4_ = auVar84._12_4_ * auVar83._12_4_;
              auVar85 = vhaddps_avx(auVar61,auVar61);
              auVar86 = vshufpd_avx(auVar61,auVar61,1);
              auVar62._0_4_ = auVar86._0_4_ + auVar85._0_4_;
              auVar62._4_4_ = auVar86._4_4_ + auVar85._4_4_;
              auVar62._8_8_ = 0;
              auVar85 = vpshufd_avx(auVar62,0xc0);
              auVar47._0_4_ = auVar83._0_4_ * auVar85._0_4_;
              auVar47._4_4_ = auVar83._4_4_ * auVar85._4_4_;
              auVar47._8_4_ = auVar83._8_4_ * auVar85._8_4_;
              auVar47._12_4_ = auVar83._12_4_ * auVar85._12_4_;
              auVar83 = vsubps_avx(auVar84,auVar47);
              *(undefined1 (*) [16])((long)bitmasks + lVar30 + 0x40) = auVar83;
              *(undefined8 *)((long)bitmasks + lVar30 + 0x50) =
                   *(undefined8 *)((long)bitmasks + lVar30 + 0x10);
              *(undefined8 *)((long)bitmasks + lVar30 + 0x58) =
                   *(undefined8 *)((long)bitmasks + lVar30 + 0x18);
              *(undefined8 *)((long)bitmasks + lVar30 + 0x60) = 0;
              *(undefined8 *)((long)bitmasks + lVar30 + 0x68) = 0;
              *(undefined8 *)((long)bitmasks + lVar30 + 0x70) =
                   *(undefined8 *)((long)bitmasks + lVar30 + 0x30);
              *(undefined8 *)((long)bitmasks + lVar30 + 0x78) =
                   *(undefined8 *)((long)bitmasks + lVar30 + 0x38);
              ppVar25 = ppVar25 + 1;
            }
            auVar52._28_4_ = 0;
            auVar52._0_2_ = mscount[2];
            auVar52._2_2_ = mscount[3];
            auVar52._4_2_ = mscount[4];
            auVar52._6_2_ = mscount[5];
            auVar52._8_2_ = mscount[6];
            auVar52._10_2_ = mscount[7];
            auVar52._12_2_ = mscount[8];
            auVar52._14_2_ = mscount[9];
            auVar52._16_2_ = mscount[10];
            auVar52._18_2_ = mscount[0xb];
            auVar52._20_2_ = mscount[0xc];
            auVar52._22_2_ = mscount[0xd];
            auVar52._24_2_ = mscount[0xe];
            auVar52._26_2_ = mscount[0xf];
            mscount._0_32_ = auVar52 << 0x20;
            auVar17._12_4_ = 0;
            auVar17._0_4_ = cluster_centers[0].m[1];
            auVar17._4_4_ = cluster_centers[0].m[2];
            auVar17._8_4_ = cluster_centers[0].m[3];
            cluster_centers[0].m = (__m128)(auVar17 << 0x20);
            compute_error_squared_rgb
                      (ppVar24,blk,(partition_lines3 *)bitmasks,(float *)mscount,
                       cluster_centers[0].m);
            puVar44 = ppVar24->partition_texel_count;
            fVar46 = (float)mscount._0_4_;
            fVar6 = cluster_centers[0].m[0];
            for (lVar30 = 0; uVar43 * 0x90 - lVar30 != 0; lVar30 = lVar30 + 0x90) {
              fVar8 = (float)local_fc8 * (float)*puVar44;
              fVar72 = *(float *)((long)afStack_bb8 + lVar30);
              fVar74 = fVar72 * *(float *)((long)bitmasks + lVar30 + 0x10);
              fVar80 = fVar72 * *(float *)((long)bitmasks + lVar30 + 0x14);
              fVar81 = fVar72 * *(float *)((long)bitmasks + lVar30 + 0x18);
              fVar82 = fVar72 * *(float *)((long)bitmasks + lVar30 + 0x1c);
              fVar69 = fVar72 * *(float *)((long)bitmasks + lVar30 + 0x30);
              fVar73 = fVar72 * *(float *)((long)bitmasks + lVar30 + 0x34);
              fVar71 = fVar72 * *(float *)((long)bitmasks + lVar30 + 0x38);
              fVar72 = fVar72 * *(float *)((long)bitmasks + lVar30 + 0x3c);
              auVar77._0_4_ = fVar8 * fVar74 * fVar74;
              auVar77._4_4_ = fVar8 * fVar80 * fVar80;
              auVar77._8_4_ = fVar8 * fVar81 * fVar81;
              auVar77._12_4_ = fVar8 * fVar82 * fVar82;
              auVar83 = vhaddps_avx(auVar77,auVar77);
              auVar84 = vshufpd_avx(auVar77,auVar77,1);
              fVar46 = fVar46 + auVar84._0_4_ + auVar83._0_4_;
              auVar63._0_4_ = fVar8 * fVar69 * fVar69;
              auVar63._4_4_ = fVar8 * fVar73 * fVar73;
              auVar63._8_4_ = fVar8 * fVar71 * fVar71;
              auVar63._12_4_ = fVar8 * fVar72 * fVar72;
              auVar83 = vhaddps_avx(auVar63,auVar63);
              auVar84 = vshufpd_avx(auVar63,auVar63,1);
              fVar6 = fVar6 + auVar84._0_4_ + auVar83._0_4_;
              puVar44 = puVar44 + 1;
            }
            mscount._0_4_ = fVar46;
            cluster_centers[0].m[0] = fVar6;
            uVar34 = (uint)local_fc0;
            insert_result(uVar34,fVar46,(uint)uVar4,uncor_best_errors,uncor_best_partitions);
            insert_result(uVar34,cluster_centers[0].m[0],(uint)uVar4,samec_best_errors,
                          samec_best_partitions);
          }
        }
        uVar14 = local_fb0;
        this = local_fd8;
        uVar27 = local_fc0 * 2;
        for (uVar43 = 0; uVar27 != uVar43; uVar43 = uVar43 + 2) {
          ppVar24 = block_size_descriptor::get_raw_partition_info
                              (this,(uint)uVar14,*(uint *)((long)uncor_best_partitions + uVar43 * 2)
                              );
          interleave[uVar43 & 0xffffffff] = (uint)ppVar24->partition_index;
          ppVar24 = block_size_descriptor::get_raw_partition_info
                              (this,(uint)uVar14,*(uint *)((long)samec_best_partitions + uVar43 * 2)
                              );
          interleave[(int)uVar43 + 1] = (uint)ppVar24->partition_index;
        }
        auVar52 = ZEXT1632(ZEXT816(0) << 0x40);
        bitmasks[0xc] = auVar52._0_8_;
        bitmasks[0xd] = auVar52._8_8_;
        bitmasks[0xe] = auVar52._16_8_;
        bitmasks[0xf] = auVar52._24_8_;
        bitmasks[8] = auVar52._0_8_;
        bitmasks[9] = auVar52._8_8_;
        bitmasks[10] = auVar52._16_8_;
        bitmasks[0xb] = auVar52._24_8_;
        auVar52 = ZEXT1632(ZEXT816(0) << 0x40);
        bitmasks[4] = auVar52._0_8_;
        bitmasks[5] = auVar52._8_8_;
        bitmasks[6] = auVar52._16_8_;
        bitmasks[7] = auVar52._24_8_;
        bitmasks[0] = auVar52._0_8_;
        bitmasks[1] = auVar52._8_8_;
        bitmasks[2] = auVar52._16_8_;
        bitmasks[3] = auVar52._24_8_;
        uVar34 = (uint)local_fc0;
        uVar27 = 0;
        uVar38 = 0;
        do {
          if (uVar34 * 2 == uVar27) {
            return uVar38;
          }
          uVar35 = interleave[uVar27];
          uVar43 = bitmasks[uVar35 >> 6];
          if ((uVar43 >> ((ulong)uVar35 & 0x3f) & 1) == 0) {
            local_f80[uVar38] = uVar35;
            bitmasks[uVar35 >> 6] = 1L << ((byte)uVar35 & 0x3f) | uVar43;
            uVar38 = uVar38 + 1;
            if (uVar38 == uVar34) {
              return uVar34;
            }
          }
          uVar27 = uVar27 + 1;
        } while( true );
      }
      __assert_fail("active_count > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_find_best_partitioning.cpp"
                    ,0x174,
                    "void count_partition_mismatch_bits(const block_size_descriptor &, unsigned int, const uint64_t *, uint8_t *)"
                   );
    }
    if (bVar2 == 0) {
      __assert_fail("texel_count > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_find_best_partitioning.cpp"
                    ,0xd9,
                    "void kmeans_update(const image_block &, unsigned int, unsigned int, vfloat4 *, const uint8_t *)"
                   );
    }
    auVar52 = ZEXT1632(ZEXT816(0) << 0x40);
    partition_sequence[0x10] = auVar52._0_2_;
    partition_sequence[0x11] = auVar52._2_2_;
    partition_sequence[0x12] = auVar52._4_2_;
    partition_sequence[0x13] = auVar52._6_2_;
    partition_sequence[0x14] = auVar52._8_2_;
    partition_sequence[0x15] = auVar52._10_2_;
    partition_sequence[0x16] = auVar52._12_2_;
    partition_sequence[0x17] = auVar52._14_2_;
    partition_sequence[0x18] = auVar52._16_2_;
    partition_sequence[0x19] = auVar52._18_2_;
    partition_sequence[0x1a] = auVar52._20_2_;
    partition_sequence[0x1b] = auVar52._22_2_;
    partition_sequence[0x1c] = auVar52._24_2_;
    partition_sequence[0x1d] = auVar52._26_2_;
    partition_sequence[0x1e] = auVar52._28_2_;
    partition_sequence[0x1f] = auVar52._30_2_;
    partition_sequence[0] = auVar52._0_2_;
    partition_sequence[1] = auVar52._2_2_;
    partition_sequence[2] = auVar52._4_2_;
    partition_sequence[3] = auVar52._6_2_;
    partition_sequence[4] = auVar52._8_2_;
    partition_sequence[5] = auVar52._10_2_;
    partition_sequence[6] = auVar52._12_2_;
    partition_sequence[7] = auVar52._14_2_;
    partition_sequence[8] = auVar52._16_2_;
    partition_sequence[9] = auVar52._18_2_;
    partition_sequence[10] = auVar52._20_2_;
    partition_sequence[0xb] = auVar52._22_2_;
    partition_sequence[0xc] = auVar52._24_2_;
    partition_sequence[0xd] = auVar52._26_2_;
    partition_sequence[0xe] = auVar52._28_2_;
    partition_sequence[0xf] = auVar52._30_2_;
    auVar15._28_4_ = 0;
    auVar15._0_28_ = bitmasks._4_28_;
    bitmasks._0_32_ = auVar15 << 0x20;
    for (uVar22 = 0; uVar27 != uVar22; uVar22 = uVar22 + 1) {
      auVar83 = vinsertps_avx(ZEXT416((uint)blk->data_r[uVar22]),ZEXT416((uint)blk->data_g[uVar22]),
                              0x10);
      auVar83 = vinsertps_avx(auVar83,ZEXT416((uint)blk->data_b[uVar22]),0x20);
      auVar83 = vinsertps_avx(auVar83,ZEXT416((uint)blk->data_a[uVar22]),0x30);
      bVar18 = *(byte *)((long)interleave + uVar22);
      pcVar1 = (char *)((long)bitmasks + (ulong)bVar18);
      *pcVar1 = *pcVar1 + '\x01';
      uVar31 = (ulong)bVar18;
      auVar75._0_4_ = auVar83._0_4_ + *(float *)(partition_sequence + uVar31 * 8);
      auVar75._4_4_ = auVar83._4_4_ + *(float *)(partition_sequence + uVar31 * 8 + 2);
      auVar75._8_4_ = auVar83._8_4_ + *(float *)(partition_sequence + uVar31 * 8 + 4);
      auVar75._12_4_ = auVar83._12_4_ + *(float *)(partition_sequence + uVar31 * 8 + 6);
      *(undefined1 (*) [16])(partition_sequence + uVar31 * 8) = auVar75;
    }
    puVar23 = bitmasks;
    for (lVar30 = 0; uVar43 << 4 != lVar30; lVar30 = lVar30 + 0x10) {
      fVar73 = 1.0 / (float)(byte)*puVar23;
      auVar76._0_4_ = fVar73 * *(float *)((long)partition_sequence + lVar30);
      auVar76._4_4_ = fVar73 * *(float *)((long)partition_sequence + lVar30 + 4);
      auVar76._8_4_ = fVar73 * *(float *)((long)partition_sequence + lVar30 + 8);
      auVar76._12_4_ = fVar73 * *(float *)((long)partition_sequence + lVar30 + 0xc);
      *(undefined1 (*) [16])((long)cluster_centers[0].m + lVar30) = auVar76;
      puVar23 = (uint64_t *)((long)puVar23 + 1);
    }
LAB_00258cff:
    if (uVar27 == 0) {
      __assert_fail("texel_count > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_find_best_partitioning.cpp"
                    ,0x99,
                    "void kmeans_assign(const image_block &, unsigned int, unsigned int, const vfloat4 *, uint8_t *)"
                   );
    }
    auVar16._28_4_ = 0;
    auVar16._0_2_ = partition_sequence[2];
    auVar16._2_2_ = partition_sequence[3];
    auVar16._4_2_ = partition_sequence[4];
    auVar16._6_2_ = partition_sequence[5];
    auVar16._8_2_ = partition_sequence[6];
    auVar16._10_2_ = partition_sequence[7];
    auVar16._12_2_ = partition_sequence[8];
    auVar16._14_2_ = partition_sequence[9];
    auVar16._16_2_ = partition_sequence[10];
    auVar16._18_2_ = partition_sequence[0xb];
    auVar16._20_2_ = partition_sequence[0xc];
    auVar16._22_2_ = partition_sequence[0xd];
    auVar16._24_2_ = partition_sequence[0xe];
    auVar16._26_2_ = partition_sequence[0xf];
    partition_sequence._0_32_ = auVar16 << 0x20;
    for (uVar22 = 0; uVar22 != uVar27; uVar22 = uVar22 + 1) {
      auVar83 = vinsertps_avx(ZEXT416((uint)blk->data_r[uVar22]),ZEXT416((uint)blk->data_g[uVar22]),
                              0x10);
      auVar83 = vinsertps_avx(auVar83,ZEXT416((uint)blk->data_b[uVar22]),0x20);
      auVar83 = vinsertps_avx(auVar83,ZEXT416((uint)blk->data_a[uVar22]),0x30);
      uVar37 = 0;
      pvVar42 = cluster_centers;
      auVar84 = SUB6416(ZEXT464(0x7f7fffff),0);
      for (uVar31 = 0; uVar43 != uVar31; uVar31 = uVar31 + 1) {
        auVar85 = vsubps_avx(auVar83,*(undefined1 (*) [16])pvVar42->m);
        auVar88._0_4_ = fVar6 * auVar85._0_4_ * auVar85._0_4_;
        auVar88._4_4_ = fVar72 * auVar85._4_4_ * auVar85._4_4_;
        auVar88._8_4_ = fVar8 * auVar85._8_4_ * auVar85._8_4_;
        auVar88._12_4_ = fVar69 * auVar85._12_4_ * auVar85._12_4_;
        auVar85 = vshufpd_avx(auVar88,auVar88,1);
        auVar89._0_4_ = auVar88._0_4_ + auVar85._0_4_;
        auVar89._4_4_ = auVar88._4_4_ + auVar85._4_4_;
        auVar89._8_4_ = auVar88._8_4_ + auVar85._8_4_;
        auVar89._12_4_ = auVar88._12_4_ + auVar85._12_4_;
        auVar85 = vhaddps_avx(auVar89,auVar89);
        if (auVar85._0_4_ < auVar84._0_4_) {
          uVar37 = uVar31 & 0xffffffff;
        }
        auVar84 = vminss_avx(auVar85,auVar84);
        pvVar42 = pvVar42 + 1;
      }
      *(char *)((long)interleave + uVar22) = (char)uVar37;
      *(char *)((long)partition_sequence + uVar37) =
           *(char *)((long)partition_sequence + uVar37) + '\x01';
    }
    uVar22 = 0;
    bVar45 = false;
    do {
      for (; bVar28 = bVar45, uVar22 != uVar43; uVar22 = uVar22 + 1) {
        if (*(char *)((long)partition_sequence + uVar22) == '\0') {
          pcVar1 = (char *)((long)partition_sequence + (ulong)*(byte *)((long)interleave + uVar22));
          *pcVar1 = *pcVar1 + -1;
          *(char *)((long)partition_sequence + uVar22) =
               *(char *)((long)partition_sequence + uVar22) + '\x01';
          *(char *)((long)interleave + uVar22) = (char)uVar22;
          bVar28 = true;
        }
        bVar45 = bVar28;
      }
      uVar22 = 0;
      bVar45 = false;
    } while (bVar28);
  }
  uVar34 = (uint)bVar2;
  if (uVar34 == 0) {
    __assert_fail("texel_count > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_find_best_partitioning.cpp"
                  ,0x42,
                  "void kmeans_init(const image_block &, unsigned int, unsigned int, vfloat4 *)");
  }
  uVar22 = 0x239e9 % (ulong)uVar34;
  auVar83 = vinsertps_avx(ZEXT416((uint)blk->data_r[uVar22]),ZEXT416((uint)blk->data_g[uVar22]),0x10
                         );
  auVar83 = vinsertps_avx(auVar83,ZEXT416((uint)blk->data_b[uVar22]),0x20);
  afVar7 = (__m128)vinsertps_avx(auVar83,ZEXT416((uint)blk->data_a[uVar22]),0x30);
  cluster_centers[0].m[0] = afVar7[0];
  cluster_centers[0].m[1] = afVar7[1];
  cluster_centers[0].m[2] = afVar7[2];
  cluster_centers[0].m[3] = afVar7[3];
  fVar73 = 0.0;
  for (uVar22 = 0; uVar31 = 1, uVar38 = partition_count * 3 - 6, uVar27 != uVar22;
      uVar22 = uVar22 + 1) {
    auVar83 = vinsertps_avx(ZEXT416((uint)blk->data_r[uVar22]),ZEXT416((uint)blk->data_g[uVar22]),
                            0x10);
    auVar83 = vinsertps_avx(auVar83,ZEXT416((uint)blk->data_b[uVar22]),0x20);
    auVar83 = vinsertps_avx(auVar83,ZEXT416((uint)blk->data_a[uVar22]),0x30);
    auVar83 = vsubps_avx(auVar83,(undefined1  [16])afVar7);
    auVar84._0_4_ = fVar6 * auVar83._0_4_ * auVar83._0_4_;
    auVar84._4_4_ = fVar72 * auVar83._4_4_ * auVar83._4_4_;
    auVar84._8_4_ = fVar8 * auVar83._8_4_ * auVar83._8_4_;
    auVar84._12_4_ = fVar69 * auVar83._12_4_ * auVar83._12_4_;
    auVar83 = vshufpd_avx(auVar84,auVar84,1);
    auVar85._0_4_ = auVar84._0_4_ + auVar83._0_4_;
    auVar85._4_4_ = auVar84._4_4_ + auVar83._4_4_;
    auVar85._8_4_ = auVar84._8_4_ + auVar83._8_4_;
    auVar85._12_4_ = auVar84._12_4_ + auVar83._12_4_;
    auVar83 = vhaddps_avx(auVar85,auVar85);
    fVar73 = fVar73 + auVar83._0_4_;
    *(float *)(partition_sequence + uVar22 * 2) = auVar83._0_4_;
  }
  do {
    uVar22 = (ulong)uVar38;
    uVar38 = uVar38 + 1;
    fVar71 = 0.0;
    for (uVar37 = 0; uVar27 != uVar37; uVar37 = uVar37 + 1) {
      fVar71 = fVar71 + *(float *)(partition_sequence + uVar37 * 2);
      if (fVar73 * *(float *)(&DAT_0031aec0 + uVar22 * 4) <= fVar71) goto LAB_00258c10;
    }
    uVar37 = (ulong)uVar34;
LAB_00258c10:
    uVar22 = uVar37 & 0xffffffff;
    if (bVar2 - 1 <= (uint)uVar37) {
      uVar22 = (ulong)(bVar2 - 1);
    }
    auVar83 = vinsertps_avx(ZEXT416((uint)blk->data_r[uVar22]),ZEXT416((uint)blk->data_g[uVar22]),
                            0x10);
    auVar83 = vinsertps_avx(auVar83,ZEXT416((uint)blk->data_b[uVar22]),0x20);
    auVar83 = vinsertps_avx(auVar83,ZEXT416((uint)blk->data_a[uVar22]),0x30);
    uVar22 = uVar31 + 1;
    *(undefined1 (*) [16])cluster_centers[uVar31].m = auVar83;
    if (uVar43 <= uVar22) goto LAB_00258cff;
    fVar73 = 0.0;
    for (uVar37 = 0; uVar31 = uVar22, uVar27 != uVar37; uVar37 = uVar37 + 1) {
      auVar84 = vinsertps_avx(ZEXT416((uint)blk->data_r[uVar37]),ZEXT416((uint)blk->data_g[uVar37]),
                              0x10);
      auVar84 = vinsertps_avx(auVar84,ZEXT416((uint)blk->data_b[uVar37]),0x20);
      auVar84 = vinsertps_avx(auVar84,ZEXT416((uint)blk->data_a[uVar37]),0x30);
      auVar84 = vsubps_avx(auVar84,auVar83);
      auVar86._0_4_ = fVar6 * auVar84._0_4_ * auVar84._0_4_;
      auVar86._4_4_ = fVar72 * auVar84._4_4_ * auVar84._4_4_;
      auVar86._8_4_ = fVar8 * auVar84._8_4_ * auVar84._8_4_;
      auVar86._12_4_ = fVar69 * auVar84._12_4_ * auVar84._12_4_;
      auVar84 = vshufpd_avx(auVar86,auVar86,1);
      auVar87._0_4_ = auVar86._0_4_ + auVar84._0_4_;
      auVar87._4_4_ = auVar86._4_4_ + auVar84._4_4_;
      auVar87._8_4_ = auVar86._8_4_ + auVar84._8_4_;
      auVar87._12_4_ = auVar86._12_4_ + auVar84._12_4_;
      auVar84 = vhaddps_avx(auVar87,auVar87);
      auVar84 = vminss_avx(auVar84,ZEXT416(*(uint *)(partition_sequence + uVar37 * 2)));
      fVar73 = fVar73 + auVar84._0_4_;
      *(float *)(partition_sequence + uVar37 * 2) = auVar84._0_4_;
    }
  } while( true );
}

Assistant:

unsigned int find_best_partition_candidates(
	const block_size_descriptor& bsd,
	const image_block& blk,
	unsigned int partition_count,
	unsigned int partition_search_limit,
	unsigned int best_partitions[TUNE_MAX_PARTITIONING_CANDIDATES],
	unsigned int requested_candidates
) {
	// Constant used to estimate quantization error for a given partitioning; the optimal value for
	// this depends on bitrate. These values have been determined empirically.
	unsigned int texels_per_block = bsd.texel_count;
	float weight_imprecision_estim = 0.055f;
	if (texels_per_block <= 20)
	{
		weight_imprecision_estim = 0.03f;
	}
	else if (texels_per_block <= 31)
	{
		weight_imprecision_estim = 0.04f;
	}
	else if (texels_per_block <= 41)
	{
		weight_imprecision_estim = 0.05f;
	}

	promise(partition_count > 0);
	promise(partition_search_limit > 0);

	weight_imprecision_estim = weight_imprecision_estim * weight_imprecision_estim;

	uint16_t partition_sequence[BLOCK_MAX_PARTITIONINGS];
	unsigned int sequence_len = compute_kmeans_partition_ordering(bsd, blk, partition_count, partition_sequence);
	partition_search_limit = astc::min(partition_search_limit, sequence_len);
	requested_candidates = astc::min(partition_search_limit, requested_candidates);

	bool uses_alpha = !blk.is_constant_channel(3);

	// Partitioning errors assuming uncorrelated-chrominance endpoints
	float uncor_best_errors[TUNE_MAX_PARTITIONING_CANDIDATES];
	unsigned int uncor_best_partitions[TUNE_MAX_PARTITIONING_CANDIDATES];

	// Partitioning errors assuming same-chrominance endpoints
	float samec_best_errors[TUNE_MAX_PARTITIONING_CANDIDATES];
	unsigned int samec_best_partitions[TUNE_MAX_PARTITIONING_CANDIDATES];

	for (unsigned int i = 0; i < requested_candidates; i++)
	{
		uncor_best_errors[i] = ERROR_CALC_DEFAULT;
		samec_best_errors[i] = ERROR_CALC_DEFAULT;
	}

	if (uses_alpha)
	{
		for (unsigned int i = 0; i < partition_search_limit; i++)
		{
			unsigned int partition = partition_sequence[i];
			const auto& pi = bsd.get_raw_partition_info(partition_count, partition);

			// Compute weighting to give to each component in each partition
			partition_metrics pms[BLOCK_MAX_PARTITIONS];

			compute_avgs_and_dirs_4_comp(pi, blk, pms);

			line4 uncor_lines[BLOCK_MAX_PARTITIONS];
			line4 samec_lines[BLOCK_MAX_PARTITIONS];

			processed_line4 uncor_plines[BLOCK_MAX_PARTITIONS];
			processed_line4 samec_plines[BLOCK_MAX_PARTITIONS];

			float line_lengths[BLOCK_MAX_PARTITIONS];

			for (unsigned int j = 0; j < partition_count; j++)
			{
				partition_metrics& pm = pms[j];

				uncor_lines[j].a = pm.avg;
				uncor_lines[j].b = normalize_safe(pm.dir, unit4());

				uncor_plines[j].amod = uncor_lines[j].a - uncor_lines[j].b * dot(uncor_lines[j].a, uncor_lines[j].b);
				uncor_plines[j].bs = uncor_lines[j].b;

				samec_lines[j].a = vfloat4::zero();
				samec_lines[j].b = normalize_safe(pm.avg, unit4());

				samec_plines[j].amod = vfloat4::zero();
				samec_plines[j].bs = samec_lines[j].b;
			}

			float uncor_error = 0.0f;
			float samec_error = 0.0f;

			compute_error_squared_rgba(pi,
			                           blk,
			                           uncor_plines,
			                           samec_plines,
			                           line_lengths,
			                           uncor_error,
			                           samec_error);

			// Compute an estimate of error introduced by weight quantization imprecision.
			// This error is computed as follows, for each partition
			//     1: compute the principal-axis vector (full length) in error-space
			//     2: convert the principal-axis vector to regular RGB-space
			//     3: scale the vector by a constant that estimates average quantization error
			//     4: for each texel, square the vector, then do a dot-product with the texel's
			//        error weight; sum up the results across all texels.
			//     4(optimized): square the vector once, then do a dot-product with the average
			//        texel error, then multiply by the number of texels.

			for (unsigned int j = 0; j < partition_count; j++)
			{
				float tpp = static_cast<float>(pi.partition_texel_count[j]);
				vfloat4 error_weights(tpp * weight_imprecision_estim);

				vfloat4 uncor_vector = uncor_lines[j].b * line_lengths[j];
				vfloat4 samec_vector = samec_lines[j].b * line_lengths[j];

				uncor_error += dot_s(uncor_vector * uncor_vector, error_weights);
				samec_error += dot_s(samec_vector * samec_vector, error_weights);
			}

			insert_result(requested_candidates, uncor_error, partition, uncor_best_errors, uncor_best_partitions);
			insert_result(requested_candidates, samec_error, partition, samec_best_errors, samec_best_partitions);
		}
	}
	else
	{
		for (unsigned int i = 0; i < partition_search_limit; i++)
		{
			unsigned int partition = partition_sequence[i];
			const auto& pi = bsd.get_raw_partition_info(partition_count, partition);

			// Compute weighting to give to each component in each partition
			partition_metrics pms[BLOCK_MAX_PARTITIONS];
			compute_avgs_and_dirs_3_comp_rgb(pi, blk, pms);

			partition_lines3 plines[BLOCK_MAX_PARTITIONS];

			for (unsigned int j = 0; j < partition_count; j++)
			{
				partition_metrics& pm = pms[j];
				partition_lines3& pl = plines[j];

				pl.uncor_line.a = pm.avg;
				pl.uncor_line.b = normalize_safe(pm.dir, unit3());

				pl.samec_line.a = vfloat4::zero();
				pl.samec_line.b = normalize_safe(pm.avg, unit3());

				pl.uncor_pline.amod = pl.uncor_line.a - pl.uncor_line.b * dot3(pl.uncor_line.a, pl.uncor_line.b);
				pl.uncor_pline.bs   = pl.uncor_line.b;

				pl.samec_pline.amod = vfloat4::zero();
				pl.samec_pline.bs   = pl.samec_line.b;
			}

			float uncor_error = 0.0f;
			float samec_error = 0.0f;

			compute_error_squared_rgb(pi,
			                          blk,
			                          plines,
			                          uncor_error,
			                          samec_error);

			// Compute an estimate of error introduced by weight quantization imprecision.
			// This error is computed as follows, for each partition
			//     1: compute the principal-axis vector (full length) in error-space
			//     2: convert the principal-axis vector to regular RGB-space
			//     3: scale the vector by a constant that estimates average quantization error
			//     4: for each texel, square the vector, then do a dot-product with the texel's
			//        error weight; sum up the results across all texels.
			//     4(optimized): square the vector once, then do a dot-product with the average
			//        texel error, then multiply by the number of texels.

			for (unsigned int j = 0; j < partition_count; j++)
			{
				partition_lines3& pl = plines[j];

				float tpp = static_cast<float>(pi.partition_texel_count[j]);
				vfloat4 error_weights(tpp * weight_imprecision_estim);

				vfloat4 uncor_vector = pl.uncor_line.b * pl.line_length;
				vfloat4 samec_vector = pl.samec_line.b * pl.line_length;

				uncor_error += dot3_s(uncor_vector * uncor_vector, error_weights);
				samec_error += dot3_s(samec_vector * samec_vector, error_weights);
			}

			insert_result(requested_candidates, uncor_error, partition, uncor_best_errors, uncor_best_partitions);
			insert_result(requested_candidates, samec_error, partition, samec_best_errors, samec_best_partitions);
		}
	}

	unsigned int interleave[2 * TUNE_MAX_PARTITIONING_CANDIDATES];
	for (unsigned int i = 0; i < requested_candidates; i++)
	{
		interleave[2 * i] = bsd.get_raw_partition_info(partition_count, uncor_best_partitions[i]).partition_index;
		interleave[2 * i + 1] = bsd.get_raw_partition_info(partition_count, samec_best_partitions[i]).partition_index;
	}

	uint64_t bitmasks[1024/64] { 0 };
	unsigned int emitted = 0;

	// Deduplicate the first "requested" entries
	for (unsigned int i = 0; i < requested_candidates * 2;  i++)
	{
		unsigned int partition = interleave[i];

		unsigned int word = partition / 64;
		unsigned int bit = partition % 64;

		bool written = bitmasks[word] & (1ull << bit);

		if (!written)
		{
			best_partitions[emitted] = partition;
			bitmasks[word] |= 1ull << bit;
			emitted++;

			if (emitted == requested_candidates)
			{
				break;
			}
		}
	}

	return emitted;
}